

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_hdr_set(bcf_hdr_t *hdr,char *fname)

{
  int iVar1;
  undefined8 in_RAX;
  char **__ptr;
  bcf_hrec_t *hrec;
  long lVar2;
  int n;
  int k;
  
  _n = in_RAX;
  __ptr = hts_readlines(fname,&n);
  if (__ptr == (char **)0x0) {
    iVar1 = 1;
  }
  else {
    for (lVar2 = 0; lVar2 < (long)n + -1; lVar2 = lVar2 + 1) {
      hrec = bcf_hdr_parse_line((bcf_hdr_t *)fname,__ptr[lVar2],&k);
      if (hrec != (bcf_hrec_t *)0x0) {
        bcf_hdr_add_hrec(hdr,hrec);
      }
      fname = __ptr[lVar2];
      free(fname);
    }
    bcf_hdr_parse_sample_line(hdr,__ptr[(long)n + -1]);
    free(__ptr[(long)n + -1]);
    free(__ptr);
    bcf_hdr_sync(hdr);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int bcf_hdr_set(bcf_hdr_t *hdr, const char *fname)
{
    int i, n;
    char **lines = hts_readlines(fname, &n);
    if ( !lines ) return 1;
    for (i=0; i<n-1; i++)
    {
        int k;
        bcf_hrec_t *hrec = bcf_hdr_parse_line(hdr,lines[i],&k);
        if ( hrec ) bcf_hdr_add_hrec(hdr, hrec);
        free(lines[i]);
    }
    bcf_hdr_parse_sample_line(hdr,lines[n-1]);
    free(lines[n-1]);
    free(lines);
    bcf_hdr_sync(hdr);
    return 0;
}